

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SeparatedSyntaxList<slang::syntax::TransRangeSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SeparatedSyntaxList<slang::syntax::TransRangeSyntax>,slang::syntax::SeparatedSyntaxList<slang::syntax::TransRangeSyntax>const&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::TransRangeSyntax> *args)

{
  SeparatedSyntaxList<slang::syntax::TransRangeSyntax> *this_00;
  SeparatedSyntaxList<slang::syntax::TransRangeSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (SeparatedSyntaxList<slang::syntax::TransRangeSyntax> *)allocate(this,0x30,8);
  slang::syntax::SeparatedSyntaxList<slang::syntax::TransRangeSyntax>::SeparatedSyntaxList
            (this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }